

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::FusionEKF(FusionEKF *this)

{
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar1;
  Tools local_340;
  Scalar local_338;
  Scalar local_330;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_2b8;
  int local_298 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_290;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_238;
  Scalar local_218;
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  Scalar local_1e8;
  Scalar local_1e0;
  Scalar local_1d8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1d0;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_190;
  Scalar local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_f0;
  int local_d0 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_c8;
  Matrix<double,__1,_1,_0,__1,_1> local_b0;
  int local_a0 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_98;
  int local_80 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_78;
  int local_60 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_58;
  int local_40 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_38;
  FusionEKF *local_10;
  FusionEKF *this_local;
  
  this->_vptr_FusionEKF = (_func_int **)&PTR__FusionEKF_00143cf0;
  local_10 = this;
  KalmanFilter::KalmanFilter(&this->ekf_);
  Tools::Tools(&this->tools);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_laser_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_radar_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->H_laser_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Hj_);
  this->is_initialized_ = false;
  this->previous_timestamp_ = 0;
  local_40[1] = 2;
  local_40[0] = 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_38,local_40 + 1,local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->R_laser_,&local_38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_38);
  local_60[1] = 3;
  local_60[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_58,local_60 + 1,local_60);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->R_radar_,&local_58);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_58);
  local_80[1] = 2;
  local_80[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_78,local_80 + 1,local_80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->H_laser_,&local_78);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_78);
  local_a0[1] = 3;
  local_a0[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_98,local_a0 + 1,local_a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->Hj_,&local_98);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_98);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_b0,4);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->ekf_).x_,&local_b0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_b0);
  local_d0[1] = 4;
  local_d0[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_c8,local_d0 + 1,local_d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).P_,&local_c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c8);
  local_f8 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_f0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).P_,
             &local_f8);
  local_100 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_f0,&local_100);
  local_108 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_108);
  local_110 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_110);
  local_118 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_118);
  local_120 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_120);
  local_128 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_128);
  local_130 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_130);
  local_138 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_138);
  local_140 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_140);
  local_148 = 1000.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_148);
  local_150 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_150);
  local_158 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_158);
  local_160 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_160);
  local_168 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_168);
  local_170 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_170);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_f0);
  local_198 = 0.0225;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_190,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_,
             &local_198);
  local_1a0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_190,&local_1a0);
  local_1a8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_1a8);
  local_1b0 = 0.0225;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_1b0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_190);
  local_1d8 = 0.09;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_1d0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_,
             &local_1d8);
  local_1e0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_1d0,&local_1e0);
  local_1e8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_1e8);
  local_1f0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_1f0);
  local_1f8 = 9e-05;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_1f8);
  local_200 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_200);
  local_208 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_208);
  local_210 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_210);
  local_218 = 0.09;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_218);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_1d0);
  local_240 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_238,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_,
             &local_240);
  local_248 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_238,&local_248);
  local_250 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_250);
  local_258 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_258);
  local_260 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_260);
  local_268 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_268);
  local_270 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_270);
  local_278 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_278);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_238);
  local_298[1] = 4;
  local_298[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_290,local_298 + 1,local_298);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).F_,&local_290);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_290);
  local_2c0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_2b8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).F_,
             &local_2c0);
  local_2c8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_2b8,&local_2c8);
  local_2d0 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_2d0);
  local_2d8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_2d8);
  local_2e0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_2e0);
  local_2e8 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_2e8);
  local_2f0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_2f0);
  local_2f8 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_2f8);
  local_300 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_300);
  local_308 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_308);
  local_310 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_310);
  local_318 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_318);
  local_320 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_320);
  local_328 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_328);
  local_330 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_330);
  local_338 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_338);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_2b8);
  this->noise_ax = 9.0;
  this->noise_ay = 9.0;
  Tools::Tools(&local_340);
  Tools::operator=(&this->tools,&local_340);
  Tools::~Tools(&local_340);
  return;
}

Assistant:

FusionEKF::FusionEKF() {
  is_initialized_ = false;

  previous_timestamp_ = 0;

  // initializing matrices
  R_laser_ = MatrixXd(2, 2);
  R_radar_ = MatrixXd(3, 3);
  H_laser_ = MatrixXd(2, 4);
  Hj_ = MatrixXd(3, 4);

  //create a 4D state vector, we don't know yet the values of the x state
  ekf_.x_ = VectorXd(4);

  //state covariance matrix P
  ekf_.P_ = MatrixXd(4, 4);
  ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;

  //laser measurement covariance
  R_laser_ << 0.0225, 0,
              0, 0.0225;

  //radar measurement covariance
  R_radar_ << 0.09, 0, 0,
              0, 0.00009, 0,
              0, 0, 0.09;

  //laser measurement matrix
  H_laser_ << 1, 0, 0, 0,
              0, 1, 0, 0;

  //the initial transition matrix F_
  ekf_.F_ = MatrixXd(4, 4);
  ekf_.F_ << 1, 0, 1, 0,
              0, 1, 0, 1,
              0, 0, 1, 0,
              0, 0, 0, 1;

  //set the acceleration noise components
  noise_ax = 9;
  noise_ay = 9;

  tools = Tools();
}